

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::ConstPool::add(ConstPool *this,void *data,size_t size,size_t *dstOffset)

{
  ZoneTree<asmjit::v1_14::ConstPool::Node> *this_00;
  size_t sVar1;
  Gap *pGVar2;
  Zone *pZVar3;
  bool bVar4;
  Error EVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  size_t size_00;
  Node *pNVar9;
  ulong uVar10;
  ulong uVar11;
  ulong local_80;
  long local_78;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *local_70;
  long local_58;
  undefined8 local_48;
  undefined1 *local_40;
  ZoneTree<asmjit::v1_14::ConstPool::Node> *local_38;
  
  EVar5 = 2;
  if (0xf < (long)size) {
    if (size == 0x10) {
      local_78 = 4;
    }
    else {
      if (size == 0x40) {
        local_78 = 6;
        bVar4 = true;
        goto LAB_0011bbeb;
      }
      if (size != 0x20) {
        return 2;
      }
      local_78 = 5;
    }
    goto LAB_0011bbe8;
  }
  switch(size) {
  case 1:
    bVar4 = false;
    local_78 = 0;
    goto LAB_0011bbeb;
  case 2:
    local_78 = 1;
    break;
  default:
    goto switchD_0011bba4_caseD_3;
  case 4:
    local_78 = 2;
    break;
  case 8:
    local_78 = 3;
  }
LAB_0011bbe8:
  bVar4 = false;
LAB_0011bbeb:
  local_40 = &this->field_0x8;
  local_70 = (ZoneTree<asmjit::v1_14::ConstPool::Node> *)(&this->field_0x8 + local_78 * 0x18);
  sVar1 = *(size_t *)(&this->field_0x18 + local_78 * 0x18);
  for (uVar11 = *(ulong *)local_70; uVar11 != 0;
      uVar11 = *(ulong *)(uVar11 + (ulong)(uVar6 >> 0x1f) * 8) & 0xfffffffffffffffe) {
    uVar6 = memcmp((void *)(uVar11 + 0x18),data,sVar1);
    if (uVar6 == 0) goto LAB_0011bc42;
  }
  uVar11 = 0;
LAB_0011bc42:
  if (uVar11 == 0) {
    local_80 = 0xffffffffffffffff;
    if (!bVar4) {
      lVar8 = local_78 + -6;
      local_80 = 0xffffffffffffffff;
      do {
        pGVar2 = this->_gaps[local_78];
        if (pGVar2 != (Gap *)0x0) {
          local_80 = pGVar2->_offset;
          sVar7 = pGVar2->_size;
          this->_gaps[local_78] = pGVar2->_next;
          pGVar2->_next = this->_gapPool;
          this->_gapPool = pGVar2;
          if (local_80 % size != 0) goto LAB_0011bf92;
          sVar7 = sVar7 - size;
          if (sVar7 != 0) {
            ConstPool_addGap(this,local_80,sVar7);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
    }
    if (local_80 == 0xffffffffffffffff) {
      sVar7 = this->_size;
      size_00 = (-size & (size + sVar7) - 1) - sVar7;
      if (size_00 != 0) {
        ConstPool_addGap(this,sVar7,size_00);
        this->_size = this->_size + size_00;
      }
      local_80 = this->_size;
      this->_size = local_80 + size;
    }
    pZVar3 = this->_zone;
    uVar11 = size + 0x1f & 0xfffffffffffffff8;
    pNVar9 = (Node *)(*(long *)pZVar3 + 7U & 0xfffffffffffffff8);
    if (pNVar9 < *(Node **)(pZVar3 + 8) &&
        uVar11 <= (ulong)((long)*(Node **)(pZVar3 + 8) - (long)pNVar9)) {
      *(Node **)pZVar3 = pNVar9 + uVar11;
    }
    else {
      pNVar9 = (Node *)Zone::_alloc(pZVar3,uVar11,8);
    }
    if (pNVar9 == (Node *)0x0) goto LAB_0011bf97;
    *(undefined8 *)pNVar9 = 0;
    *(undefined8 *)(pNVar9 + 8) = 0;
    pNVar9[0x10] = (Node)((byte)pNVar9[0x10] & 0xfe);
    *(int *)(pNVar9 + 0x14) = (int)local_80;
    memcpy(pNVar9 + 0x18,data,size);
    while (pNVar9 != (Node *)0x0) {
      local_48 = *(undefined8 *)(local_70 + 0x10);
      ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>
                (local_70,pNVar9,(Compare *)&local_48);
      *(long *)(local_70 + 8) = *(long *)(local_70 + 8) + 1;
      uVar11 = this->_alignment;
      if (this->_alignment <= size) {
        uVar11 = size;
      }
      this->_alignment = uVar11;
      *dstOffset = local_80;
      if (size < 5) {
LAB_0011bf50:
        uVar11 = this->_minItemSize;
        uVar10 = size;
        if (uVar11 < size) {
          uVar10 = uVar11;
        }
        if (uVar11 == 0) {
          uVar10 = size;
        }
        this->_minItemSize = uVar10;
        goto LAB_0011bf6f;
      }
      local_58 = 1;
      local_70 = (ZoneTree<asmjit::v1_14::ConstPool::Node> *)size;
      while (local_78 != 0) {
        local_58 = local_58 * 2;
        local_38 = local_70;
        local_70 = (ZoneTree<asmjit::v1_14::ConstPool::Node> *)((ulong)local_70 >> 1);
        if (local_58 != 0) {
          this_00 = (ZoneTree<asmjit::v1_14::ConstPool::Node> *)(local_40 + (local_78 + -1) * 0x18);
          uVar11 = (ulong)(local_70 + 0x1f) & 0xfffffffffffffff8;
          lVar8 = 0;
          dstOffset = (size_t *)data;
          do {
            sVar1 = *(size_t *)(this_00 + 0x10);
            for (uVar10 = *(ulong *)this_00; uVar10 != 0;
                uVar10 = *(ulong *)(uVar10 + (ulong)(uVar6 >> 0x1f) * 8) & 0xfffffffffffffffe) {
              uVar6 = memcmp((void *)(uVar10 + 0x18),dstOffset,sVar1);
              if (uVar6 == 0) goto LAB_0011be92;
            }
            uVar10 = 0;
LAB_0011be92:
            if (uVar10 == 0) {
              pZVar3 = this->_zone;
              pNVar9 = (Node *)(*(long *)pZVar3 + 7U & 0xfffffffffffffff8);
              if (pNVar9 < *(Node **)(pZVar3 + 8) &&
                  uVar11 <= (ulong)((long)*(Node **)(pZVar3 + 8) - (long)pNVar9)) {
                *(Node **)pZVar3 = pNVar9 + uVar11;
              }
              else {
                pNVar9 = (Node *)Zone::_alloc(pZVar3,uVar11,8);
              }
              *(undefined8 *)pNVar9 = 0;
              *(undefined8 *)(pNVar9 + 8) = 0;
              pNVar9[0x10] = (Node)((byte)pNVar9[0x10] | 1);
              *(int *)(pNVar9 + 0x14) = (int)lVar8 * (int)local_70 + (int)local_80;
              memcpy(pNVar9 + 0x18,dstOffset,(size_t)local_70);
              local_48 = *(undefined8 *)(this_00 + 0x10);
              ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>
                        (this_00,pNVar9,(Compare *)&local_48);
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
            }
            lVar8 = lVar8 + 1;
            dstOffset = (size_t *)((long)dstOffset + (long)local_70);
          } while (lVar8 != local_58);
        }
        local_78 = local_78 + -1;
        if (local_38 < (ZoneTree<asmjit::v1_14::ConstPool::Node> *)0xa) goto LAB_0011bf50;
      }
      add();
LAB_0011bf92:
      add();
LAB_0011bf97:
      pNVar9 = (Node *)0x0;
    }
    EVar5 = 1;
  }
  else {
    *dstOffset = (ulong)*(uint *)(uVar11 + 0x14);
LAB_0011bf6f:
    EVar5 = 0;
  }
switchD_0011bba4_caseD_3:
  return EVar5;
}

Assistant:

Error ConstPool::add(const void* data, size_t size, size_t& dstOffset) noexcept {
  size_t treeIndex;

  if (size == 64)
    treeIndex = kIndex64;
  else if (size == 32)
    treeIndex = kIndex32;
  else if (size == 16)
    treeIndex = kIndex16;
  else if (size == 8)
    treeIndex = kIndex8;
  else if (size == 4)
    treeIndex = kIndex4;
  else if (size == 2)
    treeIndex = kIndex2;
  else if (size == 1)
    treeIndex = kIndex1;
  else
    return DebugUtils::errored(kErrorInvalidArgument);

  ConstPool::Node* node = _tree[treeIndex].get(data);
  if (node) {
    dstOffset = node->_offset;
    return kErrorOk;
  }

  // Before incrementing the current offset try if there is a gap that can be used for the requested data.
  size_t offset = ~size_t(0);
  size_t gapIndex = treeIndex;

  while (gapIndex != kIndexCount - 1) {
    ConstPool::Gap* gap = _gaps[treeIndex];

    // Check if there is a gap.
    if (gap) {
      size_t gapOffset = gap->_offset;
      size_t gapSize = gap->_size;

      // Destroy the gap for now.
      _gaps[treeIndex] = gap->_next;
      ConstPool_freeGap(this, gap);

      offset = gapOffset;
      ASMJIT_ASSERT(Support::isAligned<size_t>(offset, size));

      gapSize -= size;
      if (gapSize > 0)
        ConstPool_addGap(this, gapOffset, gapSize);
    }

    gapIndex++;
  }

  if (offset == ~size_t(0)) {
    // Get how many bytes have to be skipped so the address is aligned accordingly to the 'size'.
    size_t diff = Support::alignUpDiff<size_t>(_size, size);

    if (diff != 0) {
      ConstPool_addGap(this, _size, diff);
      _size += diff;
    }

    offset = _size;
    _size += size;
  }

  // Add the initial node to the right index.
  node = ConstPool::Tree::_newNode(_zone, data, size, offset, false);
  if (ASMJIT_UNLIKELY(!node))
    return DebugUtils::errored(kErrorOutOfMemory);

  _tree[treeIndex].insert(node);
  _alignment = Support::max<size_t>(_alignment, size);

  dstOffset = offset;

  // Now create a bunch of shared constants that are based on the data pattern. We stop at size 4,
  // it probably doesn't make sense to split constants down to 1 byte.
  size_t pCount = 1;
  size_t smallerSize = size;

  while (smallerSize > 4) {
    pCount <<= 1;
    smallerSize >>= 1;

    ASMJIT_ASSERT(treeIndex != 0);
    treeIndex--;

    const uint8_t* pData = static_cast<const uint8_t*>(data);
    for (size_t i = 0; i < pCount; i++, pData += smallerSize) {
      node = _tree[treeIndex].get(pData);
      if (node) continue;

      node = ConstPool::Tree::_newNode(_zone, pData, smallerSize, offset + (i * smallerSize), true);
      _tree[treeIndex].insert(node);
    }
  }

  if (_minItemSize == 0)
    _minItemSize = size;
  else
    _minItemSize = Support::min(_minItemSize, size);

  return kErrorOk;
}